

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priolist.c
# Opt level: O0

void nn_priolist_advance(nn_priolist *self,int release)

{
  int iVar1;
  nn_list_item *local_30;
  nn_list_item *local_28;
  nn_list_item *it;
  nn_priolist_slot *slot;
  int release_local;
  nn_priolist *self_local;
  
  if (self->current < 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->current > 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/utils/priolist.c"
            ,0x9a);
    fflush(_stderr);
    nn_err_abort();
  }
  it = (nn_list_item *)(self->slots + (self->current + -1));
  if (release == 0) {
    local_28 = nn_list_next((nn_list *)it,((nn_list *)it)[1].first + 1);
  }
  else {
    local_28 = nn_list_erase((nn_list *)it,((nn_list *)it)[1].first + 1);
  }
  if (local_28 == (nn_list_item *)0x0) {
    local_28 = nn_list_begin((nn_list *)it);
  }
  if (local_28 == (nn_list_item *)0x0) {
    local_30 = (nn_list_item *)0x0;
  }
  else {
    local_30 = local_28 + -1;
  }
  ((nn_list *)it)[1].first = local_30;
  while( true ) {
    iVar1 = nn_list_empty((nn_list *)it);
    if (iVar1 == 0) {
      return;
    }
    self->current = self->current + 1;
    if (0x10 < self->current) break;
    it = (nn_list_item *)(self->slots + (self->current + -1));
  }
  self->current = -1;
  return;
}

Assistant:

void nn_priolist_advance (struct nn_priolist *self, int release)
{
    struct nn_priolist_slot *slot;
    struct nn_list_item *it;

    nn_assert (self->current > 0);
    slot = &self->slots [self->current - 1];

    /*  Move slot's current pointer to the next pipe. */
    if (release)
        it = nn_list_erase (&slot->pipes, &slot->current->item);
    else
        it = nn_list_next (&slot->pipes, &slot->current->item);
    if (!it)
        it = nn_list_begin (&slot->pipes);
    slot->current = nn_cont (it, struct nn_priolist_data, item);

    /* If there are no more pipes in this slot, find a non-empty slot with
       lower priority. */
    while (nn_list_empty (&slot->pipes)) {
        ++self->current;
        if (self->current > NN_PRIOLIST_SLOTS) {
            self->current = -1;
            return;
        }
        slot = &self->slots [self->current - 1];
    }
}